

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_loop_close(uv_loop_t *loop)

{
  void *pvVar1;
  void *saved_data;
  uv_handle_t *h;
  QUEUE *q;
  uv_loop_t *loop_local;
  
  if (loop->active_reqs == (void **)loop->active_reqs[0]) {
    for (h = (uv_handle_t *)loop->handle_queue[0]; h != (uv_handle_t *)loop->handle_queue;
        h = (uv_handle_t *)h->data) {
      if (((undefined1  [32])h->u & (undefined1  [32])0x8000) == (undefined1  [32])0x0) {
        return -0x10;
      }
    }
    uv__loop_close(loop);
    pvVar1 = loop->data;
    memset(loop,0xff,0x350);
    loop->data = pvVar1;
    if (loop == default_loop_ptr) {
      default_loop_ptr = (uv_loop_t *)0x0;
    }
    loop_local._4_4_ = 0;
  }
  else {
    loop_local._4_4_ = -0x10;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_loop_close(uv_loop_t* loop) {
  QUEUE* q;
  uv_handle_t* h;
#ifndef NDEBUG
  void* saved_data;
#endif

  if (uv__has_active_reqs(loop))
    return UV_EBUSY;

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);
    if (!(h->flags & UV_HANDLE_INTERNAL))
      return UV_EBUSY;
  }

  uv__loop_close(loop);

#ifndef NDEBUG
  saved_data = loop->data;
  memset(loop, -1, sizeof(*loop));
  loop->data = saved_data;
#endif
  if (loop == default_loop_ptr)
    default_loop_ptr = NULL;

  return 0;
}